

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509name.cc
# Opt level: O2

int X509_NAME_add_entry_by_NID
              (X509_NAME *name,int nid,int type,uchar *bytes,int len,int loc,int set)

{
  int iVar1;
  X509_NAME_ENTRY *ne;
  
  ne = X509_NAME_ENTRY_create_by_NID((X509_NAME_ENTRY **)0x0,nid,type,bytes,len);
  if (ne == (X509_NAME_ENTRY *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = X509_NAME_add_entry(name,ne,loc,set);
    X509_NAME_ENTRY_free(ne);
  }
  return iVar1;
}

Assistant:

int X509_NAME_add_entry_by_NID(X509_NAME *name, int nid, int type,
                               const unsigned char *bytes, ossl_ssize_t len,
                               int loc, int set) {
  X509_NAME_ENTRY *ne =
      X509_NAME_ENTRY_create_by_NID(NULL, nid, type, bytes, len);
  if (!ne) {
    return 0;
  }
  int ret = X509_NAME_add_entry(name, ne, loc, set);
  X509_NAME_ENTRY_free(ne);
  return ret;
}